

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000175680 = 0x2e2e2e2e2e2e2e;
    uRam0000000000175687 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00175670 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000175678 = 0x2e2e2e2e2e2e2e;
    DAT_0017567f = 0x2e;
    _DAT_00175660 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000175668 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00175650 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000175658 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000175648 = 0x2e2e2e2e2e2e2e2e;
    DAT_0017568f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }